

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 556_reverseWordsInAString.cpp
# Opt level: O2

string * reverseWords(string *__return_storage_ptr__,string *s)

{
  pointer pcVar1;
  int iVar2;
  size_t i;
  ulong uVar3;
  long lVar4;
  
  lVar4 = 0;
  uVar3 = 0;
  iVar2 = 0;
  while( true ) {
    pcVar1 = (s->_M_dataplus)._M_p;
    if (s->_M_string_length <= uVar3) break;
    if (pcVar1[uVar3] == ' ') {
      std::__reverse<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                (pcVar1 + iVar2,pcVar1 + (lVar4 >> 0x20));
      iVar2 = (int)uVar3 + 1;
    }
    uVar3 = uVar3 + 1;
    lVar4 = lVar4 + 0x100000000;
  }
  std::__reverse<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            (pcVar1 + iVar2,pcVar1 + s->_M_string_length);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)s);
  return __return_storage_ptr__;
}

Assistant:

string reverseWords(string s) {
    int begin=0,end=-1;
    for (size_t i=0;i<s.size();i++)
    {
        if (s[i]==' ')
        {
            end = i;
            reverse(s.begin()+begin,s.begin()+end);
            begin = end+1;
        }
    }
    reverse(s.begin()+begin,s.end());
    return s;
}